

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O2

Decision __thiscall
tonk::ReceiverBandwidthControl::UpdateCC
          (ReceiverBandwidthControl *this,uint64_t nowUsec,uint smoothedSendDelayUsec)

{
  ostringstream *this_00;
  Channel *pCVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  OutputWorker *this_01;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  LogStringBuffer local_1b0;
  
  uVar6 = (this->Bandwidth).Measurement.SmoothedMinTripUsec;
  uVar8 = (smoothedSendDelayUsec + uVar6) * 8;
  uVar7 = 4000000;
  if (4000000 < uVar8) {
    uVar7 = uVar8;
  }
  this->MinOWD_WindowUsec = uVar7;
  uVar7 = (this->RecentMaxBW).Samples[0].Value;
  if ((this->Bandwidth).Measurement.SmoothedPLR <= 0.1) {
    iVar4 = this->Momentum;
    if (10000 < ((this->RecentOWD).Samples[0].Value.Value - (this->MinOWD).Samples[0].Value.Value) *
                8) goto LAB_001408b1;
    this->Momentum = 1;
    iVar5 = (int)this->LastTickUsec;
    this->LastTickUsec = nowUsec;
    bVar9 = iVar4 < 1;
    if (this->InSlowStart != false) {
      uVar6 = (this->NextShape).AppBPS;
      if (uVar6 * 3 >> 2 <= uVar7) {
        (this->NextShape).AppBPS = uVar6 * 2;
      }
      goto LAB_00140a5d;
    }
    bVar3 = false;
  }
  else {
    iVar4 = this->Momentum;
LAB_001408b1:
    bVar9 = -1 < iVar4;
    bVar3 = true;
    this->Momentum = -1;
    iVar5 = (int)this->LastTickUsec;
    this->LastTickUsec = nowUsec;
    if (this->InSlowStart != false) {
      this->InSlowStart = false;
      pCVar1 = (this->Deps).Logger;
      if ((int)pCVar1->ChannelMinLevel < 2) {
        local_1b0.ChannelName = pCVar1->ChannelName;
        this_00 = &local_1b0.LogStream;
        local_1b0.LogLevel = Debug;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,(string *)&pCVar1->Prefix);
        std::operator<<((ostream *)this_00,"Leaving slow-start");
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,&local_1b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        in_XMM1._8_8_ = extraout_XMM1_Qb;
        in_XMM1._0_8_ = extraout_XMM1_Qa;
      }
      auVar2 = vcvtusi2ss_avx512f(in_XMM1,uVar7);
      uVar6 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar2._0_4_ * 0.9)));
      (this->NextShape).AppBPS = uVar6;
      goto LAB_00140a5d;
    }
  }
  uVar8 = (int)nowUsec - iVar5;
  if (39999 < uVar8) {
    uVar8 = 40000;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (ulong)(uVar8 * 0x514) * (ulong)(this->Bandwidth).Measurement.SmoothedGoodputBPS;
  uVar8 = SUB164(auVar2 / ZEXT816(10000000000),0);
  if (uVar6 < 0x186a1) {
LAB_00140a17:
    if (!bVar3) {
LAB_00140a44:
      uVar6 = (this->NextShape).AppBPS;
      if (uVar6 * 3 >> 2 <= uVar7) {
        (this->NextShape).AppBPS = uVar6 + uVar8;
      }
      goto LAB_00140a5d;
    }
  }
  else {
    if (bVar9 == false) {
      uVar8 = (uVar8 * 100000) / uVar6;
      goto LAB_00140a17;
    }
    auVar2 = vcvtusi2ss_avx512f(in_XMM1,(this->NextShape).AppBPS);
    uVar8 = (uVar8 * 100000) / uVar6;
    if (!bVar3) {
      uVar6 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar2._0_4_ * 1.1)));
      (this->NextShape).AppBPS = uVar6;
      goto LAB_00140a44;
    }
    uVar6 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar2._0_4_ * 0.9)));
    (this->NextShape).AppBPS = uVar6;
  }
  uVar6 = (this->NextShape).AppBPS;
  uVar7 = uVar6 + uVar8 * -2;
  if (uVar8 * 2 <= uVar6 && uVar7 != 0) {
    (this->NextShape).AppBPS = uVar7;
  }
LAB_00140a5d:
  return (Decision)(bVar9 ^ 1);
}

Assistant:

ReceiverBandwidthControl::Decision ReceiverBandwidthControl::UpdateCC(
    uint64_t nowUsec,
    unsigned smoothedSendDelayUsec)
{
    bool updated = false;


    // Estimate minimum RTT so we know how long we have to flush the queue we build up
    const unsigned owd_send_usec = smoothedSendDelayUsec;
    const unsigned owd_recv_usec = Bandwidth.Measurement.SmoothedMinTripUsec;
    unsigned min_rtt_usec = owd_send_usec + owd_recv_usec;
    if (min_rtt_usec <= 0) {
        min_rtt_usec = 100000; // Default until we have a full round trip
    }

    // Wait at least 8 round trips to find the minimum OWD
    MinOWD_WindowUsec = min_rtt_usec * 8;

    // Wait at least 4 seconds
    if (MinOWD_WindowUsec < 4000000) {
        MinOWD_WindowUsec = 4000000;
    }


    // Maximum recently seen bandwidth
    const unsigned maxBW = RecentMaxBW.GetBest();


    // In reaction to high PLR we should decrease rate.
    // In reaction to moderate PLR we should not increase rate.
    const float plr = Bandwidth.Measurement.SmoothedPLR;

    if (plr > TONKCC_CONGESTION_PLR)
    {
        // Reduce BW
        updated = (Momentum >= 0);
        Momentum = -1;
    }
    else
    {
        // Update queuing delay for each packet that arrives
        const Counter32 queue_delayTS24 = RecentOWD.GetBest() - MinOWD.GetBest();
        const unsigned queue_delay_usec = queue_delayTS24.ToUnsigned() << kTime23LostBits;

        // If queue delay is detected:
        if (queue_delay_usec > protocol::kDetectQueueDelayUsec)
        {
            // Reduce BW
            updated = (Momentum >= 0);
            Momentum = -1;
        }
        else
        {
            // Increase BW
            updated = (Momentum <= 0);
            Momentum = 1;
        }
    }


    // Time since last tick
    unsigned tickIntervalUsec = static_cast<unsigned>(nowUsec - LastTickUsec);
    if (tickIntervalUsec > protocol::kSendTimerTickIntervalUsec * 8) {
        tickIntervalUsec = protocol::kSendTimerTickIntervalUsec * 8;
    }
    LastTickUsec = nowUsec;

    if (InSlowStart)
    {
        if (Momentum < 0)
        {
            InSlowStart = false;
            Deps.Logger->Debug("Leaving slow-start");

            NextShape.AppBPS = (unsigned)(maxBW * 0.9f);
        }
        else
        {
            // If we have hit the previous target:
            if (maxBW >= (NextShape.AppBPS * 3 / 4)) {
                NextShape.AppBPS *= 2;
            }
        }
    }
    else
    {
        const unsigned bps = Bandwidth.Measurement.SmoothedGoodputBPS;

        // Rate expression selected by manually checking a fixed-rate simulation
        // from 125 KB/s, 250 KB/s, ..., 2 MB/s, 4 MB/s
        uint64_t rate = tickIntervalUsec * 1300;
        rate *= bps;
        rate /= protocol::kSendTimerTickIntervalUsec * 2000000ULL;
        unsigned bpsDelta = static_cast<unsigned>(rate);

        const unsigned owdUsec = Bandwidth.Measurement.SmoothedMinTripUsec;

        // If there is moderate or high latency, then percentage jumps help a lot
        if (owdUsec > 100000)
        {
            // Skip ahead in the right direction
            if (updated) {
                if (Momentum < 0) {
                    NextShape.AppBPS = (unsigned)(NextShape.AppBPS * 0.9f);
                }
                else {
                    NextShape.AppBPS = (unsigned)(NextShape.AppBPS * 1.1f);
                }
            }

            bpsDelta *= 100000;
            bpsDelta /= owdUsec;
        }

        // If in congestion:
        if (Momentum < 0)
        {
            if (NextShape.AppBPS > bpsDelta * 2) {
                NextShape.AppBPS -= bpsDelta * 2;
            }
        }
        // If caution is not raised:
        else if (maxBW >= (NextShape.AppBPS * 3 / 4))
        {
            NextShape.AppBPS += bpsDelta;
        }
    }

    return updated ? Decision::PushUpdateInAck : Decision::NoChange;
}